

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::CubicSpline::apply_permutation
          (CubicSpline *this,vector<double,_std::allocator<double>_> *v,
          vector<int,_std::allocator<int>_> *p)

{
  value_type vVar1;
  undefined8 this_00;
  size_type __n;
  const_reference pvVar2;
  const_reference pvVar3;
  reference pvVar4;
  vector<int,_std::allocator<int>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  allocator_type *in_RDI;
  size_t i;
  size_t n;
  vector<double,_std::allocator<double>_> *sorted_vec;
  allocator_type *__a;
  vector<double,_std::allocator<double>_> *this_01;
  ulong local_48;
  undefined1 local_2a [42];
  
  __a = in_RDI;
  local_2a._10_8_ = in_RCX;
  local_2a._18_8_ = in_RDX;
  __n = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  local_2a[1] = 0;
  this_01 = (vector<double,_std::allocator<double>_> *)local_2a;
  local_2a._2_8_ = __n;
  std::allocator<double>::allocator((allocator<double> *)0x3a5b92);
  std::vector<double,_std::allocator<double>_>::vector(this_01,__n,__a);
  std::allocator<double>::~allocator((allocator<double> *)0x3a5bb2);
  for (local_48 = 0; this_00 = local_2a._18_8_, local_48 < (ulong)local_2a._2_8_;
      local_48 = local_48 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_2a._10_8_,local_48);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)this_00,(long)*pvVar2);
    vVar1 = *pvVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)__a,local_48);
    *pvVar4 = vVar1;
  }
  return (vector<double,_std::allocator<double>_> *)in_RDI;
}

Assistant:

std::vector<RealType> CubicSpline::apply_permutation(
      const std::vector<RealType>& v, const std::vector<int>& p) const {
    std::size_t n = p.size();
    std::vector<RealType> sorted_vec(n);

    for (std::size_t i = 0; i < n; ++i) {
      sorted_vec[i] = v[p[i]];
    }

    return sorted_vec;
  }